

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::MessageGenerator::GenerateEquals
          (MessageGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  string *value;
  FieldDescriptor *field_00;
  FieldGenerator *pFVar5;
  OneofDescriptor *oneof;
  FieldDescriptor *field;
  int i_1;
  string local_48;
  OneofDescriptor *local_28;
  OneofDescriptor *oneof_desc;
  Printer *pPStack_18;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  iVar3 = Descriptor::field_count(this->descriptor_);
  if ((iVar3 != 0) || (bVar2 = Params::store_unknown_fields(this->params_), bVar2)) {
    io::Printer::Print(pPStack_18,"\n@Override\npublic boolean equals(Object o) {\n");
    io::Printer::Indent(pPStack_18);
    pPVar1 = pPStack_18;
    value = Descriptor::name_abi_cxx11_(this->descriptor_);
    io::Printer::Print(pPVar1,
                       "if (o == this) {\n  return true;\n}\nif (!(o instanceof $classname$)) {\n  return false;\n}\n$classname$ other = ($classname$) o;\n"
                       ,"classname",value);
    for (oneof_desc._4_4_ = 0; iVar3 = oneof_desc._4_4_,
        iVar4 = Descriptor::oneof_decl_count(this->descriptor_), iVar3 < iVar4;
        oneof_desc._4_4_ = oneof_desc._4_4_ + 1) {
      local_28 = Descriptor::oneof_decl(this->descriptor_,oneof_desc._4_4_);
      pPVar1 = pPStack_18;
      UnderscoresToCamelCase_abi_cxx11_(&local_48,(javanano *)local_28,oneof);
      io::Printer::Print(pPVar1,
                         "if (this.$oneof_name$Case_ != other.$oneof_name$Case_) {\n  return false;\n}\n"
                         ,"oneof_name",&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
    for (field._0_4_ = 0; iVar3 = Descriptor::field_count(this->descriptor_), (int)field < iVar3;
        field._0_4_ = (int)field + 1) {
      field_00 = Descriptor::field(this->descriptor_,(int)field);
      pFVar5 = FieldGeneratorMap::get(&this->field_generators_,field_00);
      (*pFVar5->_vptr_FieldGenerator[10])(pFVar5,pPStack_18);
    }
    bVar2 = Params::store_unknown_fields(this->params_);
    if (bVar2) {
      io::Printer::Print(pPStack_18,
                         "if (unknownFieldData == null || unknownFieldData.isEmpty()) {\n  return other.unknownFieldData == null || other.unknownFieldData.isEmpty();\n} else {\n  return unknownFieldData.equals(other.unknownFieldData);\n}"
                        );
    }
    else {
      io::Printer::Print(pPStack_18,"return true;\n");
    }
    io::Printer::Outdent(pPStack_18);
    io::Printer::Print(pPStack_18,"}\n");
  }
  return;
}

Assistant:

void MessageGenerator::GenerateEquals(io::Printer* printer) {
  // Don't override if there are no fields. We could generate an
  // equals method that compares types, but often empty messages
  // are used as namespaces.
  if (descriptor_->field_count() == 0 && !params_.store_unknown_fields()) {
    return;
  }

  printer->Print(
    "\n"
    "@Override\n"
    "public boolean equals(Object o) {\n");
  printer->Indent();
  printer->Print(
    "if (o == this) {\n"
    "  return true;\n"
    "}\n"
    "if (!(o instanceof $classname$)) {\n"
    "  return false;\n"
    "}\n"
    "$classname$ other = ($classname$) o;\n",
    "classname", descriptor_->name());

  // Checking oneof case before checking each oneof field.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof_desc = descriptor_->oneof_decl(i);
    printer->Print(
      "if (this.$oneof_name$Case_ != other.$oneof_name$Case_) {\n"
      "  return false;\n"
      "}\n",
      "oneof_name", UnderscoresToCamelCase(oneof_desc));
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    field_generators_.get(field).GenerateEqualsCode(printer);
  }

  if (params_.store_unknown_fields()) {
    printer->Print(
      "if (unknownFieldData == null || unknownFieldData.isEmpty()) {\n"
      "  return other.unknownFieldData == null || other.unknownFieldData.isEmpty();\n"
      "} else {\n"
      "  return unknownFieldData.equals(other.unknownFieldData);\n"
      "}");
  } else {
    printer->Print(
      "return true;\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}